

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O3

void addlenmod(char *form,char *lenmod)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  
  sVar2 = strlen(form);
  sVar3 = strlen(lenmod);
  cVar1 = form[sVar2 - 1];
  strcpy(form + (sVar2 - 1),lenmod);
  form[(sVar3 - 1) + sVar2] = cVar1;
  form[sVar3 + sVar2] = '\0';
  return;
}

Assistant:

static void addlenmod (char *form, const char *lenmod) {
  size_t l = strlen(form);
  size_t lm = strlen(lenmod);
  char spec = form[l - 1];
  strcpy(form + l - 1, lenmod);
  form[l + lm - 1] = spec;
  form[l + lm] = '\0';
}